

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O3

void __thiscall
aggreports::OutputRows
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,char *buffer,int strLen)

{
  pointer pmVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  code *pcVar5;
  mapped_type *pmVar6;
  int epcalc;
  aggreports *paVar7;
  pointer piVar8;
  ulong *extraout_RDX;
  int unaff_EBX;
  aggreports *paVar9;
  uint uVar10;
  ulong unaff_RBP;
  char *pcVar11;
  aggreports *paVar12;
  float *in_R8;
  int in_R9D;
  map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  *unaff_R12;
  int *piVar13;
  code *unaff_R13;
  ulong uVar14;
  long unaff_R14;
  ulong uVar15;
  aggreports *unaff_R15;
  double extraout_XMM0_Qa;
  double dVar16;
  undefined8 in_XMM1_Qa;
  double in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  float fStack_d0;
  int iStack_cc;
  double dStack_c8;
  float fStack_c0;
  float fStack_bc;
  double dStack_b8;
  aggreports *paStack_b0;
  float *pfStack_a8;
  long *plStack_a0;
  double dStack_98;
  char *pcStack_90;
  double dStack_88;
  double dStack_80;
  aggreports *paStack_78;
  int *piStack_70;
  ulong uStack_68;
  ulong uStack_60;
  aggreports *paStack_58;
  ulong uStack_50;
  aggreports *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  piVar13 = (fileIDs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  if (piVar13 !=
      (fileIDs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar15 = (ulong)(uint)strLen;
    local_40 = (aggreports *)buffer;
    local_38 = fileIDs;
    do {
      uVar14 = 1;
      paVar9 = local_40;
LAB_0010b24e:
      paVar7 = (aggreports *)(long)*piVar13;
      pcVar11 = "%s";
      uStack_50 = 0x10b26b;
      uVar3 = fprintf((FILE *)this->fout_[(long)paVar7],"%s",paVar9);
      fStack_c0 = (float)in_XMM1_Qa;
      fStack_bc = (float)in_XMM3_Qa;
      if ((int)uVar3 < 0) {
        uStack_50 = 0x10b2d1;
        OutputRows(local_40);
        goto LAB_0010b2d1;
      }
      uVar10 = (int)uVar15 - uVar3;
      unaff_RBP = (ulong)uVar10;
      if (uVar10 != 0 && (int)uVar3 <= (int)uVar15) goto code_r0x0010b276;
      piVar13 = piVar13 + 1;
    } while (piVar13 !=
             (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
code_r0x0010b276:
  paVar9 = (aggreports *)((long)&paVar9->totalperiods_ + (ulong)uVar3);
  pcVar11 = "INFO: Attempt %d to write %s\n";
  uStack_50 = 0x10b29b;
  paVar7 = local_40;
  fprintf(_stderr,"INFO: Attempt %d to write %s\n",uVar14);
  fStack_c0 = (float)in_XMM1_Qa;
  fStack_bc = (float)in_XMM3_Qa;
  uVar3 = (int)uVar14 + 1;
  uVar14 = (ulong)uVar3;
  uVar15 = (ulong)uVar10;
  if (uVar3 == 0xb) {
LAB_0010b2d1:
    uStack_50 = 0x10b2db;
    paVar12 = local_40;
    OutputRows(local_40);
    dStack_98 = (double)fStack_c0;
    bVar2 = fStack_c0 != 0.0;
    plStack_a0 = (long *)((long)&paVar12->totalperiods_ + unaff_R14);
    uVar4 = *extraout_RDX;
    dVar16 = extraout_XMM0_Qa;
    iStack_cc = in_R9D;
    dStack_b8 = extraout_XMM0_Qa;
    paStack_b0 = paVar7;
    pfStack_a8 = in_R8;
    pcStack_90 = pcVar11;
    dStack_80 = in_XMM2_Qa;
    paStack_78 = paVar9;
    piStack_70 = piVar13;
    uStack_68 = uVar14;
    uStack_60 = uVar15;
    paStack_58 = this;
    uStack_50 = unaff_RBP;
    goto LAB_0010b372;
  }
  goto LAB_0010b24e;
  while( true ) {
    if (dStack_c8 <= dStack_80) {
      fStack_d0 = 0.0;
      if (bVar2 && extraout_XMM0_Qa != 0.0) {
        fStack_d0 = fStack_c0;
        if (((dStack_c8 != dVar16) || (NAN(dStack_c8) || NAN(dVar16))) &&
           (fStack_d0 = -1.0, dVar16 < dStack_c8)) {
          fStack_d0 = (float)((((double)*pfStack_a8 - dStack_98) * (dStack_c8 - dVar16)) /
                              (*(double *)paStack_b0 - dVar16) + dStack_98);
        }
      }
      if (unaff_R13 != (code *)0x0) {
        pcVar5 = unaff_R13;
        if (((ulong)unaff_R13 & 1) != 0) {
          pcVar5 = *(code **)(unaff_R13 + *plStack_a0 + -1);
        }
        piVar8 = (pointer)((ulong)local_38 & 0xffffffff);
        (*pcVar5)(dStack_c8,plStack_a0,pcStack_90,iStack_cc,piVar8,(ulong)local_40 & 0xffffffff);
        dVar16 = dStack_b8;
      }
      epcalc = (int)piVar8;
      paVar9 = unaff_R15;
      if (unaff_R15 != (aggreports *)0x0) {
        pmVar6 = std::
                 map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                 ::operator[]((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                               *)unaff_R15,&iStack_cc);
        (pmVar6->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
        super__Vector_impl_data._M_start[*extraout_RDX].retperiod = dStack_c8;
        dStack_88 = (double)fStack_d0;
        pmVar6 = std::
                 map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                 ::operator[]((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                               *)unaff_R15,&iStack_cc);
        pmVar1 = (pmVar6->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pmVar1[*extraout_RDX].mean = dStack_88 + pmVar1[*extraout_RDX].mean;
        pmVar6 = std::
                 map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                 ::operator[]((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                               *)unaff_R15,&iStack_cc);
        epcalc = (int)*extraout_RDX * 3;
        piVar13 = &(pmVar6->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
                   super__Vector_impl_data._M_start[*extraout_RDX].count;
        *piVar13 = *piVar13 + 1;
        dVar16 = dStack_b8;
      }
      if ((dVar16 != 0.0) || (NAN(dVar16))) {
        fStack_bc = fStack_bc - (fStack_bc - fStack_d0) / (float)unaff_EBX;
        FillTVaR(paVar9,unaff_R12,iStack_cc,epcalc,dStack_c8,fStack_bc);
        dVar16 = dStack_b8;
      }
      uVar4 = *extraout_RDX + 1;
      *extraout_RDX = uVar4;
      unaff_EBX = unaff_EBX + 1;
    }
    else {
      uVar4 = uVar4 + 1;
      *extraout_RDX = uVar4;
    }
    if (dStack_c8 < dVar16) break;
LAB_0010b372:
    piVar8 = (paVar12->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(paVar12->returnperiods_).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar8 >> 2) <= uVar4) {
      return;
    }
    dStack_c8 = (double)piVar8[uVar4];
    if (dStack_c8 < dVar16) break;
  }
  if (0.0 < dVar16) {
    *(double *)paStack_b0 = dVar16;
    *pfStack_a8 = fStack_c0;
  }
  return;
}

Assistant:

inline void aggreports::OutputRows(const std::vector<int> &fileIDs,
				   const char * buffer, int strLen) {

  for (std::vector<int>::const_iterator it = fileIDs.begin();
       it != fileIDs.end(); ++it) {

    const char * bufPtr = buffer;
    int num;
    int counter = 0;
    do {

      num = fprintf(fout_[*it], "%s", bufPtr);
      if (num < 0) {   // Write error
	fprintf(stderr, "FATAL: Error writing %s: %s\n",
		buffer, strerror(errno));
	exit(EXIT_FAILURE);
      } else if (num < strLen) {   // Incomplete write
	bufPtr += num;
	strLen -= num;
      } else break;   // Success

      fprintf(stderr, "INFO: Attempt %d to write %s\n", ++counter, buffer);

      if (counter == 10) {
	fprintf(stderr, "FATAL: Maximum attempts to write %s exceeded\n",
		buffer);
	exit(EXIT_FAILURE);
      }

    } while (true);

  }

}